

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void set_block_size(AV1_COMP *cpi,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  int iVar1;
  int iVar2;
  undefined1 *puVar3;
  undefined1 in_CL;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  MB_MODE_INFO *mi;
  int mi_alloc_idx;
  int mi_grid_idx;
  CommonModeInfoParams *mi_params;
  
  if ((in_EDX < *(int *)(in_RDI + 0x3c198)) && (in_ESI < *(int *)(in_RDI + 0x3c194))) {
    iVar1 = get_mi_grid_idx((CommonModeInfoParams *)(in_RDI + 0x3c188),in_ESI,in_EDX);
    iVar2 = get_alloc_mi_idx((CommonModeInfoParams *)(in_RDI + 0x3c188),in_ESI,in_EDX);
    puVar3 = (undefined1 *)(*(long *)(in_RDI + 0x3c1a0) + (long)iVar2 * 0xb0);
    *(undefined1 **)(*(long *)(in_RDI + 0x3c1b8) + (long)iVar1 * 8) = puVar3;
    *puVar3 = in_CL;
  }
  return;
}

Assistant:

static inline void set_block_size(AV1_COMP *const cpi, int mi_row, int mi_col,
                                  BLOCK_SIZE bsize) {
  if (cpi->common.mi_params.mi_cols > mi_col &&
      cpi->common.mi_params.mi_rows > mi_row) {
    CommonModeInfoParams *mi_params = &cpi->common.mi_params;
    const int mi_grid_idx = get_mi_grid_idx(mi_params, mi_row, mi_col);
    const int mi_alloc_idx = get_alloc_mi_idx(mi_params, mi_row, mi_col);
    MB_MODE_INFO *mi = mi_params->mi_grid_base[mi_grid_idx] =
        &mi_params->mi_alloc[mi_alloc_idx];
    mi->bsize = bsize;
  }
}